

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ConversionStream
          (ConversionStream *this,IReferenceCounters *pRefCounters,HLSL2GLSLConverterImpl *Converter
          ,char *InputFileName,IShaderSourceInputStreamFactory *pInputStreamFactory,Char *HLSLSource
          ,size_t NumSymbols,bool bPreserveTokens)

{
  TokenListType *pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  ConversionStream *this_00;
  RefCntAutoPtr<Diligent::IDataBlob> pFileData;
  String Source;
  RefCntAutoPtr<Diligent::IFileStream> pSourceStream;
  char *InputFileName_local;
  
  InputFileName_local = InputFileName;
  ObjectBase<Diligent::IHLSL2GLSLConversionStream>::ObjectBase
            (&this->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>,pRefCounters);
  (this->super_ObjectBase<Diligent::IHLSL2GLSLConversionStream>).
  super_RefCountedObject<Diligent::IHLSL2GLSLConversionStream>.super_IHLSL2GLSLConversionStream.
  super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_00a5abb0;
  pTVar1 = &this->m_Tokens;
  (this->m_Tokens).
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pTVar1;
  (this->m_Tokens).
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pTVar1;
  (this->m_Tokens).
  super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
  ._M_impl._M_node._M_size = 0;
  (this->m_StructDefinitions)._M_h._M_buckets = &(this->m_StructDefinitions)._M_h._M_single_bucket;
  (this->m_StructDefinitions)._M_h._M_bucket_count = 1;
  (this->m_StructDefinitions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_StructDefinitions)._M_h._M_element_count = 0;
  (this->m_StructDefinitions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_StructDefinitions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_StructDefinitions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_PreprocessorDefinitions)._M_h._M_buckets =
       &(this->m_PreprocessorDefinitions)._M_h._M_single_bucket;
  (this->m_PreprocessorDefinitions)._M_h._M_bucket_count = 1;
  (this->m_PreprocessorDefinitions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_PreprocessorDefinitions)._M_h._M_element_count = 0;
  (this->m_PreprocessorDefinitions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_PreprocessorDefinitions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_PreprocessorDefinitions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_Objects).
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Objects).
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Objects).
  super__Vector_base<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType,_std::allocator<Diligent::HLSL2GLSLConverterImpl::ObjectsTypeHashType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_bPreserveTokens = bPreserveTokens;
  this->m_bUseInOutLocationQualifiers = true;
  this->m_bUseRowMajorMatrices = false;
  this->m_Converter = Converter;
  pcVar3 = "<Unknown>";
  if (InputFileName != (char *)0x0) {
    pcVar3 = InputFileName;
  }
  std::__cxx11::string::string((string *)&this->m_InputFileName,pcVar3,(allocator *)&Source);
  pFileData.m_pObject = (IDataBlob *)0x0;
  if (HLSLSource == (Char *)0x0) {
    if (InputFileName == (char *)0x0) {
      LogError<true,char[71]>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x1157,(char (*) [71])
                         "Input file name must not be null when HLSL source code is not provided");
    }
    if (pInputStreamFactory == (IShaderSourceInputStreamFactory *)0x0) {
      LogError<true,char[76]>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x115a,(char (*) [76])
                         "Input stream factory must not be null when HLSL source code is not provided"
                );
    }
    Source._M_string_length = (size_type)&pSourceStream;
    pSourceStream.m_pObject = (IFileStream *)0x0;
    Source._M_dataplus._M_p = (pointer)0x0;
    (*(pInputStreamFactory->super_IObject)._vptr_IObject[4])(pInputStreamFactory);
    RefCntAutoPtr<Diligent::IFileStream>::DoublePtrHelper<Diligent::IFileStream>::~DoublePtrHelper
              ((DoublePtrHelper<Diligent::IFileStream> *)&Source);
    if (pSourceStream.m_pObject == (IFileStream *)0x0) {
      LogError<true,char[35],char_const*>
                (false,"ConversionStream",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                 ,0x115f,(char (*) [35])"Failed to open shader source file ",&InputFileName_local);
    }
    DataBlobImpl::Create((DataBlobImpl *)&Source,0,(void *)0x0);
    RefCntAutoPtr<Diligent::IDataBlob>::operator=
              (&pFileData,(RefCntAutoPtr<Diligent::DataBlobImpl> *)&Source);
    RefCntAutoPtr<Diligent::DataBlobImpl>::Release((RefCntAutoPtr<Diligent::DataBlobImpl> *)&Source)
    ;
    (*((pSourceStream.m_pObject)->super_IObject)._vptr_IObject[5])
              (pSourceStream.m_pObject,pFileData.m_pObject);
    iVar2 = (*((pFileData.m_pObject)->super_IObject)._vptr_IObject[6])(pFileData.m_pObject,0);
    HLSLSource = (Char *)CONCAT44(extraout_var,iVar2);
    iVar2 = (*((pFileData.m_pObject)->super_IObject)._vptr_IObject[5])();
    NumSymbols = CONCAT44(extraout_var_00,iVar2);
    RefCntAutoPtr<Diligent::IFileStream>::Release(&pSourceStream);
  }
  Source._M_dataplus._M_p = (pointer)&Source.field_2;
  this_00 = (ConversionStream *)&Source;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)this_00,HLSLSource,HLSLSource + NumSymbols);
  InsertIncludes(this_00,&Source,pInputStreamFactory);
  Parsing::HLSLTokenizer::Tokenize
            ((TokenListType *)&pSourceStream,&this->m_Converter->m_HLSLTokenizer,&Source);
  std::__cxx11::
  list<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_move_assign(pTVar1,(_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                         *)&pSourceStream);
  std::__cxx11::
  _List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>::
  _M_clear((_List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
            *)&pSourceStream);
  std::__cxx11::string::~string((string *)&Source);
  RefCntAutoPtr<Diligent::IDataBlob>::Release(&pFileData);
  return;
}

Assistant:

HLSL2GLSLConverterImpl::ConversionStream::ConversionStream(IReferenceCounters*              pRefCounters,
                                                           const HLSL2GLSLConverterImpl&    Converter,
                                                           const char*                      InputFileName,
                                                           IShaderSourceInputStreamFactory* pInputStreamFactory,
                                                           const Char*                      HLSLSource,
                                                           size_t                           NumSymbols,
                                                           bool                             bPreserveTokens) :
    // clang-format off
    TBase            {pRefCounters   },
    m_bPreserveTokens{bPreserveTokens},
    m_Converter      {Converter      },
    m_InputFileName  {InputFileName != nullptr ? InputFileName : "<Unknown>"}
// clang-format on
{
    RefCntAutoPtr<IDataBlob> pFileData;
    if (HLSLSource == nullptr)
    {
        if (InputFileName == nullptr)
            LOG_ERROR_AND_THROW("Input file name must not be null when HLSL source code is not provided");

        if (pInputStreamFactory == nullptr)
            LOG_ERROR_AND_THROW("Input stream factory must not be null when HLSL source code is not provided");

        RefCntAutoPtr<IFileStream> pSourceStream;
        pInputStreamFactory->CreateInputStream(InputFileName, &pSourceStream);
        if (pSourceStream == nullptr)
            LOG_ERROR_AND_THROW("Failed to open shader source file ", InputFileName);

        pFileData = DataBlobImpl::Create();
        pSourceStream->ReadBlob(pFileData);
        HLSLSource = reinterpret_cast<char*>(pFileData->GetDataPtr());
        NumSymbols = pFileData->GetSize();
    }

    String Source(HLSLSource, NumSymbols);

    InsertIncludes(Source, pInputStreamFactory);

    m_Tokens = m_Converter.m_HLSLTokenizer.Tokenize(Source);
}